

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall QGles2Buffer::destroy(QGles2Buffer *this)

{
  QRhiImplementation *pQVar1;
  long in_FS_OFFSET;
  DeferredReleaseEntry e;
  DeferredReleaseEntry local_34;
  QGles2Buffer *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::clear();
  if (this->buffer != 0) {
    local_34.field_1.renderbuffer.renderbuffer2 = 0xaaaaaaaa;
    local_34._0_8_ = (ulong)this->buffer << 0x20;
    this->buffer = 0;
    pQVar1 = (this->super_QRhiBuffer).super_QRhiResource.m_rhi;
    if (pQVar1 != (QRhiImplementation *)0x0) {
      QtPrivate::QPodArrayOps<QRhiGles2::DeferredReleaseEntry>::
      emplace<QRhiGles2::DeferredReleaseEntry_const&>
                ((QPodArrayOps<QRhiGles2::DeferredReleaseEntry> *)&pQVar1[2].implThread,
                 pQVar1[2].resUpdPool.super_QVLABase<QRhiResourceUpdateBatch_*>.super_QVLABaseBase.s
                 ,&local_34);
      QList<QRhiGles2::DeferredReleaseEntry>::end
                ((QList<QRhiGles2::DeferredReleaseEntry> *)&pQVar1[2].implThread);
      local_28 = this;
      QHash<QRhiResource*,bool>::removeImpl<QRhiResource*>
                ((QHash<QRhiResource*,bool> *)&pQVar1->resources,(QRhiResource **)&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGles2Buffer::destroy()
{
    data.clear();
    if (!buffer)
        return;

    QRhiGles2::DeferredReleaseEntry e;
    e.type = QRhiGles2::DeferredReleaseEntry::Buffer;

    e.buffer.buffer = buffer;
    buffer = 0;

    QRHI_RES_RHI(QRhiGles2);
    if (rhiD) {
        rhiD->releaseQueue.append(e);
        rhiD->unregisterResource(this);
    }
}